

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::CountDomain::Print(CountDomain *this,DebugWriter *w)

{
  uint uVar1;
  Char *form;
  
  uVar1 = this->upper;
  if (this->lower == uVar1 && uVar1 != 0xffffffff) {
    form = L"[%u]";
  }
  else {
    DebugWriter::Print(w,L"[%u-");
    uVar1 = this->upper;
    if (uVar1 == 0xffffffff) {
      DebugWriter::Print(w,L"inf]");
      return;
    }
    form = L"%u]";
  }
  DebugWriter::Print(w,form,(ulong)uVar1);
  return;
}

Assistant:

void CountDomain::Print(DebugWriter* w) const
    {
        if (upper != CharCountFlag && lower == (CharCount)upper)
        {
            w->Print(_u("[%u]"), lower);
        }
        else
        {
            w->Print(_u("[%u-"), lower);
            if (upper == CharCountFlag)
                w->Print(_u("inf]"));
            else
                w->Print(_u("%u]"), (CharCount)upper);
        }
    }